

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __thiscall
__cxxabiv1::anon_unknown_0::parse_block_invoke<__cxxabiv1::(anonymous_namespace)::Db>
          (anon_unknown_0 *this,char *first,char *last,Db *db)

{
  anon_unknown_0 *paVar1;
  anon_unknown_0 *paVar2;
  long lVar3;
  
  if (0xc < (long)first - (long)this) {
    paVar1 = this + 0xd;
    lVar3 = 0;
    do {
      if (this[lVar3] != *(anon_unknown_0 *)("_block_invoke" + lVar3)) {
        return (char *)this;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xd);
    paVar2 = paVar1;
    if (paVar1 != (anon_unknown_0 *)first) {
      if (*paVar1 == (anon_unknown_0)0x5f) {
        if (this + 0xe == (anon_unknown_0 *)first) {
          return (char *)this;
        }
        if (9 < (int)(char)this[0xe] - 0x30U) {
          return (char *)this;
        }
        paVar1 = this + 0xf;
        paVar2 = paVar1;
      }
      for (; (paVar1 != (anon_unknown_0 *)first &&
             (paVar2 = paVar1, (int)(char)*paVar1 - 0x30U < 10)); paVar1 = paVar1 + 1) {
        paVar2 = (anon_unknown_0 *)first;
      }
    }
    if ((Db *)last != db) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                 *)&db[-1].subs.
                    super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish,0,0,
                "invocation function for block in ",0x21);
      this = paVar2;
    }
  }
  return (char *)this;
}

Assistant:

const char*
parse_block_invoke(const char* first, const char* last, C& db)
{
    if (last - first >= 13)
    {
        const char test[] = "_block_invoke";
        const char* t = first;
        for (int i = 0; i < 13; ++i, ++t)
        {
            if (*t != test[i])
                return first;
        }
        if (t != last)
        {
            if (*t == '_')
            {
                // must have at least 1 decimal digit
                if (++t == last || !std::isdigit(*t))
                    return first;
                ++t;
            }
            // parse zero or more digits
            while (t != last && isdigit(*t))
                ++t;
        }
        if (db.names.empty())
            return first;
        db.names.back().first.insert(0, "invocation function for block in ");
        first = t;
    }
    return first;
}